

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_core_module.c
# Opt level: O2

ngx_http_cleanup_t * ngx_http_cleanup_add(ngx_http_request_t *r,size_t size)

{
  ngx_http_request_t *pnVar1;
  ngx_log_t *log;
  ngx_http_cleanup_t *pnVar2;
  void *pvVar3;
  
  pnVar1 = r->main;
  pnVar2 = (ngx_http_cleanup_t *)ngx_palloc(pnVar1->pool,0x18);
  if (pnVar2 == (ngx_http_cleanup_t *)0x0) {
LAB_0013933d:
    pnVar2 = (ngx_http_cleanup_t *)0x0;
  }
  else {
    if (size == 0) {
      pnVar2->data = (void *)0x0;
    }
    else {
      pvVar3 = ngx_palloc(pnVar1->pool,size);
      pnVar2->data = pvVar3;
      if (pvVar3 == (void *)0x0) goto LAB_0013933d;
    }
    pnVar2->handler = (ngx_http_cleanup_pt)0x0;
    pnVar2->next = pnVar1->cleanup;
    pnVar1->cleanup = pnVar2;
    log = pnVar1->connection->log;
    if ((log->log_level & 0x100) != 0) {
      ngx_log_error_core(8,log,0,"http cleanup add: %p",pnVar2);
    }
  }
  return pnVar2;
}

Assistant:

ngx_http_cleanup_t *
ngx_http_cleanup_add(ngx_http_request_t *r, size_t size)
{
    ngx_http_cleanup_t  *cln;

    r = r->main;

    cln = ngx_palloc(r->pool, sizeof(ngx_http_cleanup_t));
    if (cln == NULL) {
        return NULL;
    }

    if (size) {
        cln->data = ngx_palloc(r->pool, size);
        if (cln->data == NULL) {
            return NULL;
        }

    } else {
        cln->data = NULL;
    }

    cln->handler = NULL;
    cln->next = r->cleanup;

    r->cleanup = cln;

    ngx_log_debug1(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "http cleanup add: %p", cln);

    return cln;
}